

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O3

void __thiscall
QNetworkRequestFactory::clearAttribute(QNetworkRequestFactory *this,Attribute attribute)

{
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this_00;
  Node<QNetworkRequest::Attribute,_QVariant> *pNVar1;
  QNetworkRequestFactoryPrivate *pQVar2;
  long in_FS_OFFSET;
  Attribute local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (((this->d).d.ptr)->attributes).d;
  local_14 = attribute;
  if (this_00 != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
             findNode<QNetworkRequest::Attribute>(this_00,&local_14);
    if (pNVar1 != (Node<QNetworkRequest::Attribute,_QVariant> *)0x0) {
      pQVar2 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
        pQVar2 = (this->d).d.ptr;
      }
      QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
                (&pQVar2->attributes,&local_14);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequestFactory::clearAttribute(QNetworkRequest::Attribute attribute)
{
    if (!d->attributes.contains(attribute))
        return;
    d.detach();
    d->attributes.remove(attribute);
}